

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::File::extractPathFromFilename
                   (string *__return_storage_ptr__,string *fullPath,char *separator)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  allocator local_29;
  long local_28;
  size_t lastSlashAt;
  char *separator_local;
  string *fullPath_local;
  
  lastSlashAt = (size_t)separator;
  separator_local = (char *)fullPath;
  fullPath_local = __return_storage_ptr__;
  bVar2 = ::std::operator==(fullPath,"");
  if ((!bVar2) && (lVar3 = ::std::__cxx11::string::find(separator_local,lastSlashAt), lVar3 != -1))
  {
    local_28 = ::std::__cxx11::string::find_last_of(separator_local,lastSlashAt);
    sVar1 = lastSlashAt;
    if (local_28 == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)sVar1,&local_29);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)separator_local);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)separator_local);
  return __return_storage_ptr__;
}

Assistant:

std::string File::extractPathFromFilename(const std::string& fullPath, const char* separator) {
  if ((fullPath == "") || (fullPath.find(separator) == std::string::npos)) {
    return fullPath;
  }
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  if (lastSlashAt == 0) {
    return std::string(separator);
  }
  return fullPath.substr(0, lastSlashAt + 1);
}